

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O1

UWORD32 ihevcd_uev(bitstrm_t *ps_bitstrm)

{
  UWORD32 UVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  UVar1 = ps_bitstrm->u4_bit_ofst;
  uVar5 = 0x20;
  uVar6 = 0;
  if (0x20 - UVar1 < 0x20) {
    uVar6 = ps_bitstrm->u4_nxt_word >> ((byte)(0x20 - UVar1) & 0x1f);
  }
  uVar6 = uVar6 | ps_bitstrm->u4_cur_word << ((byte)UVar1 & 0x1f);
  if (uVar6 != 0) {
    uVar5 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x1f;
  }
  uVar6 = UVar1 + uVar5 + 1;
  ps_bitstrm->u4_bit_ofst = uVar6;
  if (0x1f < uVar6) {
    ps_bitstrm->u4_cur_word = ps_bitstrm->u4_nxt_word;
    puVar2 = ps_bitstrm->pu4_buf;
    ps_bitstrm->pu4_buf = puVar2 + 1;
    uVar6 = *puVar2;
    ps_bitstrm->u4_bit_ofst = (UVar1 + uVar5) - 0x1f;
    ps_bitstrm->u4_nxt_word =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  }
  if (uVar5 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ps_bitstrm->u4_cur_word << ((byte)ps_bitstrm->u4_bit_ofst & 0x1f)) >>
            (-(byte)uVar5 & 0x1f);
    uVar4 = ps_bitstrm->u4_bit_ofst + uVar5;
    ps_bitstrm->u4_bit_ofst = uVar4;
    if (0x20 < uVar4) {
      uVar3 = 0;
      if (0x40 - uVar4 < 0x20) {
        uVar3 = ps_bitstrm->u4_nxt_word >> ((byte)(0x40 - uVar4) & 0x1f);
      }
      uVar6 = uVar6 | uVar3;
    }
    if (0x1f < uVar4) {
      ps_bitstrm->u4_cur_word = ps_bitstrm->u4_nxt_word;
      puVar2 = ps_bitstrm->pu4_buf;
      ps_bitstrm->pu4_buf = puVar2 + 1;
      uVar3 = *puVar2;
      ps_bitstrm->u4_bit_ofst = uVar4 - 0x20;
      ps_bitstrm->u4_nxt_word =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    }
  }
  return ~(-1 << ((byte)uVar5 & 0x1f)) + uVar6;
}

Assistant:

UWORD32 ihevcd_uev(bitstrm_t *ps_bitstrm)
{
    UWORD32 u4_bits_read;
    UWORD32 u4_clz;


    /***************************************************************/
    /* Find leading zeros in next 32 bits                          */
    /***************************************************************/
    BITS_NXT32(u4_bits_read,
               ps_bitstrm->pu4_buf,
               ps_bitstrm->u4_bit_ofst,
               ps_bitstrm->u4_cur_word,
               ps_bitstrm->u4_nxt_word);


    u4_clz = CLZ(u4_bits_read);

    BITS_FLUSH(ps_bitstrm->pu4_buf,
               ps_bitstrm->u4_bit_ofst,
               ps_bitstrm->u4_cur_word,
               ps_bitstrm->u4_nxt_word,
               (u4_clz + 1));

    u4_bits_read = 0;
    if(u4_clz)
    {
        BITS_GET(u4_bits_read,
                 ps_bitstrm->pu4_buf,
                 ps_bitstrm->u4_bit_ofst,
                 ps_bitstrm->u4_cur_word,
                 ps_bitstrm->u4_nxt_word,
                 u4_clz);
    }
    return ((1 << u4_clz) + u4_bits_read - 1);

}